

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageOneofFieldLiteGenerator::GenerateMembers
          (ImmutableLazyMessageOneofFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &(this->super_ImmutableLazyMessageFieldLiteGenerator).
               super_ImmutableMessageFieldLiteGenerator.variables_;
  PrintExtraFieldInfo(variables,printer);
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldLiteGenerator).
                     super_ImmutableMessageFieldLiteGenerator.descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public boolean has$capitalized_name$() {\n  return $has_oneof_case_message$;\n}\n"
                    );
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldLiteGenerator).
                     super_ImmutableMessageFieldLiteGenerator.descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    return ($type$) (($lazy_type$) $oneof_name$_).getValue(\n        $type$.getDefaultInstance());\n  }\n  return $type$.getDefaultInstance();\n}\n"
                    );
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldLiteGenerator).
                     super_ImmutableMessageFieldLiteGenerator.descriptor_);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$($type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  if (!($has_oneof_case_message$)) {\n    $oneof_name$_ = new $lazy_type$();\n    $set_oneof_case_message$;\n  }\n  (($lazy_type$) $oneof_name$_).setValue(value);\n}\n"
                    );
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldLiteGenerator).
                     super_ImmutableMessageFieldLiteGenerator.descriptor_);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$(\n    $type$.Builder builderForValue) {\n  if (!($has_oneof_case_message$)) {\n    $oneof_name$_ = new $lazy_type$();\n    $set_oneof_case_message$;\n  }\n  (($lazy_type$) $oneof_name$_).setValue(builderForValue.build());\n}\n"
                    );
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldLiteGenerator).
                     super_ImmutableMessageFieldLiteGenerator.descriptor_);
  io::Printer::Print(printer,variables,
                     "private void merge$capitalized_name$($type$ value) {\n  if ($has_oneof_case_message$ &&\n      !(($lazy_type$) $oneof_name$_).containsDefaultInstance()) {\n    (($lazy_type$) $oneof_name$_).setValue(\n       $type$.newBuilder(\n          get$capitalized_name$()).mergeFrom(value).buildPartial());\n  } else {\n    if (!($has_oneof_case_message$)) {\n      $oneof_name$_ = new $lazy_type$();\n      $set_oneof_case_message$;\n    }\n    (($lazy_type$) $oneof_name$_).setValue(value);\n  }\n}\n"
                    );
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldLiteGenerator).
                     super_ImmutableMessageFieldLiteGenerator.descriptor_);
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n  }\n}\n"
                    );
  return;
}

Assistant:

void ImmutableLazyMessageOneofFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_);

  printer->Print(variables_,
    "$deprecation$public boolean has$capitalized_name$() {\n"
    "  return $has_oneof_case_message$;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);

  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    return ($type$) (($lazy_type$) $oneof_name$_).getValue(\n"
    "        $type$.getDefaultInstance());\n"
    "  }\n"
    "  return $type$.getDefaultInstance();\n"
    "}\n");

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$($type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  if (!($has_oneof_case_message$)) {\n"
    "    $oneof_name$_ = new $lazy_type$();\n"
    "    $set_oneof_case_message$;\n"
    "  }\n"
    "  (($lazy_type$) $oneof_name$_).setValue(value);\n"
    "}\n");

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$(\n"
    "    $type$.Builder builderForValue) {\n"
    "  if (!($has_oneof_case_message$)) {\n"
    "    $oneof_name$_ = new $lazy_type$();\n"
    "    $set_oneof_case_message$;\n"
    "  }\n"
    "  (($lazy_type$) $oneof_name$_).setValue(builderForValue.build());\n"
    "}\n");

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void merge$capitalized_name$($type$ value) {\n"
    "  if ($has_oneof_case_message$ &&\n"
    "      !(($lazy_type$) $oneof_name$_).containsDefaultInstance()) {\n"
    "    (($lazy_type$) $oneof_name$_).setValue(\n"
    "       $type$.newBuilder(\n"
    "          get$capitalized_name$()).mergeFrom(value).buildPartial());\n"
    "  } else {\n"
    "    if (!($has_oneof_case_message$)) {\n"
    "      $oneof_name$_ = new $lazy_type$();\n"
    "      $set_oneof_case_message$;\n"
    "    }\n"
    "    (($lazy_type$) $oneof_name$_).setValue(value);\n"
    "  }\n"
    "}\n");

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    $clear_oneof_case_message$;\n"
    "    $oneof_name$_ = null;\n"
    "  }\n"
    "}\n");
}